

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_ptr.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int (*p) [10];
  int arr [10];
  char **argv_local;
  int argc_local;
  
  memset(&p,0,0x28);
  p._0_4_ = 100;
  p._4_4_ = 200;
  arr[0] = 300;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,100);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p._4_4_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    int arr[10] = {100, 200, 300};

    int (*p)[10] = &arr;

    std::cout << arr[0] << std::endl;
    std::cout << (*p)[1] << std::endl;

    // int (*p1)[20] = &arr;

    return 0;
}